

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

JavascriptString *
Js::JavascriptRegExp::GetFirstStringArg(Arguments *args,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptString *pJVar2;
  Var pvVar3;
  
  if (((ulong)args->Info & 0xffffff) == 1) {
    pJVar2 = StringCache::GetUndefinedDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
    return pJVar2;
  }
  pvVar3 = Arguments::operator[](args,1);
  bVar1 = VarIs<Js::JavascriptString>(pvVar3);
  if (bVar1) {
    pJVar2 = UnsafeVarTo<Js::JavascriptString>(pvVar3);
    if (pJVar2 != (JavascriptString *)0x0) {
      return pJVar2;
    }
  }
  pvVar3 = Arguments::operator[](args,1);
  pJVar2 = JavascriptConversion::ToString(pvVar3,scriptContext);
  return pJVar2;
}

Assistant:

JavascriptString* JavascriptRegExp::GetFirstStringArg(Arguments& args, ScriptContext* scriptContext)
    {
        if (args.Info.Count == 1)
        {
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }
        else
        {
            JavascriptString *jsString = JavascriptOperators::TryFromVar<JavascriptString>(args[1]);
            if (jsString)
            {
                return jsString;
            }
            else
            {
                return JavascriptConversion::ToString(args[1], scriptContext);
            }
        }
    }